

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

Matrix<float,_2,_4> * __thiscall
vkt::sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,2,4>
          (Matrix<float,_2,_4> *__return_storage_ptr__,MatrixCaseUtils *this,
          Matrix<float,_2,_4> *mat)

{
  int c;
  Matrix<float,_2,_4> *pMVar1;
  long lVar2;
  float *pfVar3;
  Matrix<float,_2,_4> *retVal;
  int col;
  long lVar4;
  bool bVar5;
  undefined4 uVar6;
  
  pMVar1 = __return_storage_ptr__;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[2].m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[3].m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[0].m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[1].m_data = 0;
  lVar2 = 0;
  pfVar3 = (float *)__return_storage_ptr__;
  do {
    lVar4 = 0;
    do {
      uVar6 = 0x3f800000;
      if (lVar2 != lVar4) {
        uVar6 = 0;
      }
      pfVar3[lVar4 * 2] = (float)uVar6;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    pfVar3 = pfVar3 + 1;
    bVar5 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar5);
  lVar2 = 0;
  do {
    lVar4 = 0;
    do {
      *(float *)((long)__return_storage_ptr__ + lVar4 * 2 * 4) = *(float *)(this + lVar4 * 8) + 1.0;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    this = this + 4;
    __return_storage_ptr__ = (Matrix<float,_2,_4> *)((long)__return_storage_ptr__ + 4);
    bVar5 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar5);
  return pMVar1;
}

Assistant:

tcu::Matrix<T, Rows, Cols> increment (const tcu::Matrix<T, Rows, Cols>& mat)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = mat(r, c) + 1.0f;

	return retVal;
}